

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

Data * __thiscall
QTzTimeZonePrivate::previousTransition
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 beforeMSecsSinceEpoch)

{
  QTzTransitionRule *pQVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  Data *pDVar6;
  undefined4 uVar9;
  QTzTransitionTime *pQVar7;
  QTzTransitionRule *pQVar8;
  undefined4 uVar10;
  ulong uVar11;
  undefined1 *puVar12;
  int iVar13;
  int iVar14;
  Data *pDVar15;
  QTzTransitionTime *pQVar16;
  undefined1 *puVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  QTzTransitionRule rule;
  QTzTransitionRule rule_00;
  QArrayDataPointer<QTimeZonePrivate::Data> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->cached_data).m_posixRule.d.size == 0) ||
     ((lVar5 = (this->cached_data).m_tranTimes.d.size, lVar5 != 0 &&
      (beforeMSecsSinceEpoch <= (this->cached_data).m_tranTimes.d.ptr[lVar5 + -1].atMSecsSinceEpoch)
      ))) {
    pQVar7 = (this->cached_data).m_tranTimes.d.ptr;
    pQVar16 = pQVar7;
    uVar18 = (this->cached_data).m_tranTimes.d.size;
    while (uVar11 = uVar18, 0 < (long)uVar11) {
      uVar18 = uVar11 >> 1;
      if (pQVar16[uVar18].atMSecsSinceEpoch < beforeMSecsSinceEpoch) {
        pQVar16 = pQVar16 + uVar18 + 1;
        uVar18 = ~uVar18 + uVar11;
      }
    }
    if (pQVar7 < pQVar16) {
      pQVar8 = (this->cached_data).m_tranRules.d.ptr;
      pQVar1 = pQVar8 + pQVar16[-1].ruleIndex;
      uVar3 = pQVar1->stdOffset;
      uVar9 = pQVar1->dstOffset;
      rule.dstOffset = uVar9;
      rule.stdOffset = uVar3;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        rule.abbreviationIndex = pQVar8[pQVar16[-1].ruleIndex].abbreviationIndex;
        rule._9_3_ = 0;
        dataFromRule(__return_storage_ptr__,this,rule,pQVar16[-1].atMSecsSinceEpoch);
        return __return_storage_ptr__;
      }
      goto LAB_0040c447;
    }
    (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
    (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->abbreviation).d.size = 0;
    __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
    __return_storage_ptr__->offsetFromUtc = -0x80000000;
    __return_storage_ptr__->standardTimeOffset = -0x80000000;
    __return_storage_ptr__->daylightTimeOffset = -0x80000000;
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions((QList<QTimeZonePrivate::Data> *)&local_48,this,beforeMSecsSinceEpoch);
    pDVar15 = local_48.ptr;
    puVar17 = (undefined1 *)local_48.size;
    while (puVar12 = puVar17, 0 < (long)puVar12) {
      puVar17 = (undefined1 *)((ulong)puVar12 >> 1);
      if (pDVar15[(long)puVar17].atMSecsSinceEpoch < beforeMSecsSinceEpoch) {
        pDVar15 = pDVar15 + (long)(puVar17 + 1);
        puVar17 = puVar12 + ~(ulong)puVar17;
      }
    }
    if (local_48.ptr < pDVar15) {
      pDVar6 = pDVar15[-1].abbreviation.d.d;
      (__return_storage_ptr__->abbreviation).d.d = pDVar6;
      (__return_storage_ptr__->abbreviation).d.ptr = pDVar15[-1].abbreviation.d.ptr;
      (__return_storage_ptr__->abbreviation).d.size = pDVar15[-1].abbreviation.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      __return_storage_ptr__->daylightTimeOffset = pDVar15[-1].daylightTimeOffset;
      iVar13 = pDVar15[-1].offsetFromUtc;
      iVar14 = pDVar15[-1].standardTimeOffset;
      __return_storage_ptr__->atMSecsSinceEpoch = pDVar15[-1].atMSecsSinceEpoch;
      __return_storage_ptr__->offsetFromUtc = iVar13;
      __return_storage_ptr__->standardTimeOffset = iVar14;
    }
    else {
      lVar5 = (this->cached_data).m_tranTimes.d.size;
      if (lVar5 == 0) {
        (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
        (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
        (__return_storage_ptr__->abbreviation).d.size = 0;
        __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
        __return_storage_ptr__->offsetFromUtc = -0x80000000;
        __return_storage_ptr__->standardTimeOffset = -0x80000000;
        __return_storage_ptr__->daylightTimeOffset = -0x80000000;
      }
      else {
        pQVar7 = (this->cached_data).m_tranTimes.d.ptr;
        pQVar8 = (this->cached_data).m_tranRules.d.ptr;
        bVar2 = pQVar7[lVar5 + -1].ruleIndex;
        pQVar1 = pQVar8 + bVar2;
        uVar4 = pQVar1->stdOffset;
        uVar10 = pQVar1->dstOffset;
        rule_00.dstOffset = uVar10;
        rule_00.stdOffset = uVar4;
        pQVar8 = pQVar8 + bVar2;
        rule_00.abbreviationIndex = pQVar8->abbreviationIndex;
        rule_00._9_3_ = *(undefined3 *)&pQVar8->field_0x9;
        dataFromRule(__return_storage_ptr__,this,rule_00,pQVar7[lVar5 + -1].atMSecsSinceEpoch);
      }
    }
    QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0040c447:
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::previousTransition(qint64 beforeMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < beforeMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(beforeMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [beforeMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch < beforeMSecsSinceEpoch;
                                       });
        if (it > posixTrans.cbegin())
            return *--it;
        // It fell between the last transition (if any) and the first of the POSIX rule:
        return tranCache().isEmpty() ? Data{} : dataForTzTransition(tranCache().last());
    }

    // Otherwise if we can find a valid tran then use its rule
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [beforeMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch < beforeMSecsSinceEpoch;
                                     });
    return last > tranCache().cbegin() ? dataForTzTransition(*--last) : Data{};
}